

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,char (*str) [2])

{
  String *other;
  String local_68;
  String local_40;
  
  String(&local_40,this);
  local_68.data = &local_68._data;
  local_68._data.ref = 0;
  local_68._data.len = 1;
  local_68._data.str = *str;
  other = append(&local_40,&local_68);
  String(__return_storage_ptr__,other);
  ~String(&local_68);
  ~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& other) const {return String(*this).append(other);}